

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_multicast(compiler_state_t *cstate,int proto)

{
  bpf_abs_offset *abs_offset;
  int iVar1;
  block *pbVar2;
  block *b1;
  slist *psVar3;
  block *pbVar4;
  ulong uVar5;
  int iStack_40;
  
  if (1 < (uint)proto) {
    if (proto != 2) {
      if (proto == 0x11) {
        pbVar2 = gen_linktype(cstate,0x86dd);
        b1 = gen_cmp(cstate,OR_LINKPL,0x18,0x10,0xff);
        goto LAB_0010edd4;
      }
      goto switchD_0010ebdc_caseD_2;
    }
    pbVar2 = gen_linktype(cstate,0x800);
    b1 = gen_cmp_ge(cstate,OR_LINKPL,0x10,0x10,0xe0);
    goto LAB_0010edd4;
  }
  iVar1 = cstate->linktype;
  uVar5 = (ulong)(iVar1 - 0x69U);
  if (0x3a < iVar1 - 0x69U) {
code_r0x0010ebce:
    switch(iVar1) {
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
    case 9:
switchD_0010ebdc_caseD_2:
      bpf_error(cstate,
                "link-layer multicast filters supported only on ethernet/FDDI/token ring/ARCNET/802.11/ATM LANE/Fibre Channel"
               );
    case 6:
      goto switchD_0010ebdc_caseD_6;
    case 7:
switchD_0010ebdc_caseD_7:
      pbVar2 = gen_ahostop(cstate,(u_char *)"",2);
      return pbVar2;
    case 10:
      iStack_40 = 1;
      goto LAB_0010ee1d;
    default:
      if (1 < iVar1 - 0xf0U) {
        if (iVar1 != 0xc0) goto switchD_0010ebdc_caseD_2;
        goto LAB_0010ec2d;
      }
    case 1:
      pbVar2 = gen_prevlinkhdr_check(cstate);
      b1 = gen_mac_multicast(cstate,0);
      if (pbVar2 == (block *)0x0) {
        return b1;
      }
LAB_0010edd4:
      gen_and(pbVar2,b1);
      return b1;
    }
  }
  if ((0x400000000404001U >> (uVar5 & 0x3f) & 1) != 0) {
LAB_0010ec2d:
    abs_offset = &cstate->off_linkhdr;
    psVar3 = gen_load_absoffsetrel(cstate,abs_offset,1,0x10);
    pbVar2 = new_block(cstate,0x45);
    (pbVar2->s).k = 1;
    pbVar2->stmts = psVar3;
    b1 = gen_mac_multicast(cstate,0x10);
    gen_and(pbVar2,b1);
    psVar3 = gen_load_absoffsetrel(cstate,abs_offset,1,0x10);
    pbVar2 = new_block(cstate,0x45);
    (pbVar2->s).k = 1;
    pbVar2->stmts = psVar3;
    pbVar2->sense = (uint)(pbVar2->sense == 0);
    pbVar4 = gen_mac_multicast(cstate,4);
    gen_and(pbVar2,pbVar4);
    gen_or(pbVar4,b1);
    psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0,0x10);
    pbVar2 = new_block(cstate,0x45);
    (pbVar2->s).k = 8;
    pbVar2->stmts = psVar3;
    gen_and(pbVar2,b1);
    psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0,0x10);
    pbVar2 = new_block(cstate,0x45);
    (pbVar2->s).k = 8;
    pbVar2->stmts = psVar3;
    pbVar2->sense = (uint)(pbVar2->sense == 0);
    pbVar4 = gen_mac_multicast(cstate,4);
    gen_and(pbVar2,pbVar4);
    gen_or(pbVar4,b1);
    psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0,0x10);
    pbVar2 = new_block(cstate,0x45);
    (pbVar2->s).k = 4;
    pbVar2->stmts = psVar3;
    pbVar2->sense = (uint)(pbVar2->sense == 0);
    goto LAB_0010edd4;
  }
  if (uVar5 != 0x11) {
    if (uVar5 == 0x18) goto switchD_0010ebdc_caseD_7;
    goto code_r0x0010ebce;
  }
switchD_0010ebdc_caseD_6:
  iStack_40 = 2;
LAB_0010ee1d:
  pbVar2 = gen_mac_multicast(cstate,iStack_40);
  return pbVar2;
}

Assistant:

struct block *
gen_multicast(compiler_state_t *cstate, int proto)
{
	register struct block *b0, *b1, *b2;
	register struct slist *s;

	switch (proto) {

	case Q_DEFAULT:
	case Q_LINK:
		switch (cstate->linktype) {
		case DLT_ARCNET:
		case DLT_ARCNET_LINUX:
			/* all ARCnet multicasts use the same address */
			return gen_ahostop(cstate, abroadcast, Q_DST);
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			b1 = gen_prevlinkhdr_check(cstate);
			/* ether[0] & 1 != 0 */
			b0 = gen_mac_multicast(cstate, 0);
			if (b1 != NULL)
				gen_and(b1, b0);
			return b0;
		case DLT_FDDI:
			/*
			 * XXX TEST THIS: MIGHT NOT PORT PROPERLY XXX
			 *
			 * XXX - was that referring to bit-order issues?
			 */
			/* fddi[1] & 1 != 0 */
			return gen_mac_multicast(cstate, 1);
		case DLT_IEEE802:
			/* tr[2] & 1 != 0 */
			return gen_mac_multicast(cstate, 2);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			/*
			 * Oh, yuk.
			 *
			 *	For control frames, there is no DA.
			 *
			 *	For management frames, DA is at an
			 *	offset of 4 from the beginning of
			 *	the packet.
			 *
			 *	For data frames, DA is at an offset
			 *	of 4 from the beginning of the packet
			 *	if To DS is clear and at an offset of
			 *	16 from the beginning of the packet
			 *	if To DS is set.
			 */

			/*
			 * Generate the tests to be done for data frames.
			 *
			 * First, check for To DS set, i.e. "link[1] & 0x01".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
			b1 = new_block(cstate, JMP(BPF_JSET));
			b1->s.k = 0x01;	/* To DS */
			b1->stmts = s;

			/*
			 * If To DS is set, the DA is at 16.
			 */
			b0 = gen_mac_multicast(cstate, 16);
			gen_and(b1, b0);

			/*
			 * Now, check for To DS not set, i.e. check
			 * "!(link[1] & 0x01)".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
			b2 = new_block(cstate, JMP(BPF_JSET));
			b2->s.k = 0x01;	/* To DS */
			b2->stmts = s;
			gen_not(b2);

			/*
			 * If To DS is not set, the DA is at 4.
			 */
			b1 = gen_mac_multicast(cstate, 4);
			gen_and(b2, b1);

			/*
			 * Now OR together the last two checks.  That gives
			 * the complete set of checks for data frames.
			 */
			gen_or(b1, b0);

			/*
			 * Now check for a data frame.
			 * I.e, check "link[0] & 0x08".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
			b1 = new_block(cstate, JMP(BPF_JSET));
			b1->s.k = 0x08;
			b1->stmts = s;

			/*
			 * AND that with the checks done for data frames.
			 */
			gen_and(b1, b0);

			/*
			 * If the high-order bit of the type value is 0, this
			 * is a management frame.
			 * I.e, check "!(link[0] & 0x08)".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
			b2 = new_block(cstate, JMP(BPF_JSET));
			b2->s.k = 0x08;
			b2->stmts = s;
			gen_not(b2);

			/*
			 * For management frames, the DA is at 4.
			 */
			b1 = gen_mac_multicast(cstate, 4);
			gen_and(b2, b1);

			/*
			 * OR that with the checks done for data frames.
			 * That gives the checks done for management and
			 * data frames.
			 */
			gen_or(b1, b0);

			/*
			 * If the low-order bit of the type value is 1,
			 * this is either a control frame or a frame
			 * with a reserved type, and thus not a
			 * frame with an SA.
			 *
			 * I.e., check "!(link[0] & 0x04)".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
			b1 = new_block(cstate, JMP(BPF_JSET));
			b1->s.k = 0x04;
			b1->stmts = s;
			gen_not(b1);

			/*
			 * AND that with the checks for data and management
			 * frames.
			 */
			gen_and(b1, b0);
			return b0;
		case DLT_IP_OVER_FC:
			b0 = gen_mac_multicast(cstate, 2);
			return b0;
		default:
			break;
		}
		/* Link not known to support multicasts */
		break;

	case Q_IP:
		b0 = gen_linktype(cstate, ETHERTYPE_IP);
		b1 = gen_cmp_ge(cstate, OR_LINKPL, 16, BPF_B, (bpf_int32)224);
		gen_and(b0, b1);
		return b1;

	case Q_IPV6:
		b0 = gen_linktype(cstate, ETHERTYPE_IPV6);
		b1 = gen_cmp(cstate, OR_LINKPL, 24, BPF_B, (bpf_int32)255);
		gen_and(b0, b1);
		return b1;
	}
	bpf_error(cstate, "link-layer multicast filters supported only on ethernet/FDDI/token ring/ARCNET/802.11/ATM LANE/Fibre Channel");
	/* NOTREACHED */
	return NULL;
}